

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O1

ssize_t __thiscall QVncClientCursor::write(QVncClientCursor *this,int __fd,void *__buf,size_t __n)

{
  ushort uVar1;
  char cVar2;
  ushort uVar3;
  undefined4 uVar4;
  int iVar5;
  int screendepth;
  QTcpSocket *pQVar6;
  char *dst;
  char *src;
  longlong lVar7;
  int iVar8;
  int iVar9;
  undefined4 in_register_00000034;
  QVncClient *this_00;
  long in_FS_OFFSET;
  qint32 encoding;
  QImage local_90 [24];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  long local_38;
  
  this_00 = (QVncClient *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QVncClient::clientSocket(this_00);
  uStack_50 = 0xaaaaaaaa;
  uVar3 = (ushort)(this->hotspot).xp.m_i;
  uVar1 = (ushort)(this->hotspot).yp.m_i;
  local_58 = CONCAT26(uVar1 << 8 | uVar1 >> 8,CONCAT24(uVar3 << 8 | uVar3 >> 8,0x1000000));
  uVar3 = QImage::width();
  uStack_50 = CONCAT22(uStack_50._2_2_,uVar3 << 8 | uVar3 >> 8);
  uVar3 = QImage::height();
  uStack_50 = CONCAT22(uVar3 << 8 | uVar3 >> 8,(undefined2)uStack_50);
  QIODevice::write((char *)pQVar6,(longlong)&local_58);
  local_78 = 0x11ffffff;
  QIODevice::write((char *)pQVar6,(longlong)&local_78);
  cVar2 = QImage::isNull();
  if (cVar2 == '\0') {
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    uVar4 = (**(code **)(**(long **)(*(long *)(this_00 + 0x10) + 0x30) + 0x78))();
    iVar8 = 0;
    QImage::convertToFormat_helper(&local_58,&this->cursor,uVar4,0);
    iVar5 = *(int *)(this_00 + 0x30);
    iVar9 = iVar5 + 7;
    if (-1 < iVar5) {
      iVar9 = iVar5;
    }
    iVar5 = QImage::width();
    screendepth = QImage::depth();
    dst = (char *)operator_new__((long)(iVar5 * (iVar9 >> 3)));
    iVar5 = QImage::height();
    if (0 < iVar5) {
      do {
        src = (char *)QImage::scanLine((int)&local_58);
        iVar5 = QImage::width();
        QVncClient::convertPixels(this_00,dst,src,iVar5,screendepth);
        QIODevice::write((char *)pQVar6,(longlong)dst);
        iVar8 = iVar8 + 1;
        iVar5 = QImage::height();
      } while (iVar8 < iVar5);
    }
    operator_delete__(dst);
    local_68 = 0xaaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    iVar9 = 0;
    QImage::createAlphaMask(local_90,&this->cursor,0);
    QImage::convertToFormat((QImage *)&local_78,(Format)local_90,(ImageConversionFlags)0x1);
    QImage::~QImage(local_90);
    QImage::width();
    iVar5 = QImage::height();
    if (0 < iVar5) {
      do {
        lVar7 = QImage::scanLine((int)&local_78);
        QIODevice::write((char *)pQVar6,lVar7);
        iVar9 = iVar9 + 1;
        iVar5 = QImage::height();
      } while (iVar9 < iVar5);
    }
    QImage::~QImage((QImage *)&local_78);
    QImage::~QImage((QImage *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QVncClientCursor::write(QVncClient *client) const
{
    QTcpSocket *socket = client->clientSocket();

    // FramebufferUpdate header
    {
        const quint16 tmp[6] = { htons(0),
                                 htons(1),
                                 htons(static_cast<uint16_t>(hotspot.x())), htons(static_cast<uint16_t>(hotspot.y())),
                                 htons(static_cast<uint16_t>(cursor.width())),
                                 htons(static_cast<uint16_t>(cursor.height())) };
        socket->write(reinterpret_cast<const char*>(tmp), sizeof(tmp));

        const qint32 encoding = qToBigEndian(-239);
        socket->write(reinterpret_cast<const char*>(&encoding), sizeof(encoding));
    }

    if (cursor.isNull())
        return;

    // write pixels
    Q_ASSERT(cursor.hasAlphaChannel());
    const QImage img = cursor.convertToFormat(client->server()->screen()->format());
    const int n = client->clientBytesPerPixel() * img.width();
    const int depth = img.depth();
    char *buffer = new char[n];
    for (int i = 0; i < img.height(); ++i) {
        client->convertPixels(buffer, (const char*)img.scanLine(i), img.width(), depth);
        socket->write(buffer, n);
    }
    delete[] buffer;

    // write mask
    const QImage bitmap = cursor.createAlphaMask().convertToFormat(QImage::Format_Mono);
    Q_ASSERT(bitmap.depth() == 1);
    Q_ASSERT(bitmap.size() == img.size());
    const int width = (bitmap.width() + 7) / 8;
    for (int i = 0; i < bitmap.height(); ++i)
        socket->write(reinterpret_cast<const char*>(bitmap.scanLine(i)), width);
}